

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::LayerNormalizationLayerParams::SharedDtor
          (LayerNormalizationLayerParams *this)

{
  if (this != (LayerNormalizationLayerParams *)&_LayerNormalizationLayerParams_default_instance_) {
    if (this->gamma_ != (WeightParams *)0x0) {
      (*(this->gamma_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->beta_ != (WeightParams *)0x0) {
      (*(this->beta_->super_MessageLite)._vptr_MessageLite[1])();
      return;
    }
  }
  return;
}

Assistant:

void LayerNormalizationLayerParams::SharedDtor() {
  if (this != internal_default_instance()) {
    delete gamma_;
  }
  if (this != internal_default_instance()) {
    delete beta_;
  }
}